

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O2

void Gs::Normalize<Gs::QuaternionT<float>,float>
               (QuaternionT<float> *outVec,QuaternionT<float> *inVec)

{
  float local_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  local_2c = LengthSq<Gs::QuaternionT<float>,float>(inVec);
  if (((local_2c == 0.0) && (!NAN(local_2c))) || ((local_2c == 1.0 && (!NAN(local_2c))))) {
    local_28 = inVec->x;
    fStack_24 = inVec->y;
    fStack_20 = inVec->z;
    fStack_1c = inVec->w;
  }
  else {
    if (local_2c < 0.0) {
      local_2c = sqrtf(local_2c);
    }
    else {
      local_2c = SQRT(local_2c);
    }
    local_2c = 1.0 / local_2c;
    operator*((Gs *)&local_28,inVec,&local_2c);
  }
  outVec->x = local_28;
  outVec->y = fStack_24;
  outVec->z = fStack_20;
  outVec->w = fStack_1c;
  return;
}

Assistant:

void Normalize(TVector& outVec, const TVector& inVec)
{
    TScalar len = LengthSq<TVector, TScalar>(inVec);
    if (len != TScalar(0) && len != TScalar(1))
    {
        len = TScalar(1) / std::sqrt(len);
        outVec = inVec * len;
    }
    else
        outVec = inVec;
}